

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O1

bool __thiscall
CLI::App::_parse_positional
          (App *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,bool haltOnSubcommand)

{
  pointer pbVar1;
  pointer pbVar2;
  pointer puVar3;
  Option *pOVar4;
  pointer pcVar5;
  pointer psVar6;
  undefined8 uVar7;
  size_t sVar8;
  App *pAVar9;
  ExtrasError *this_00;
  undefined7 in_register_00000011;
  char cVar10;
  pointer psVar11;
  pointer puVar12;
  bool bVar13;
  string pos;
  undefined1 local_e0 [32];
  App *local_c0;
  undefined4 local_b4;
  vector<CLI::Option*,std::allocator<CLI::Option*>> *local_b0;
  string local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  local_b4 = (undefined4)CONCAT71(in_register_00000011,haltOnSubcommand);
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  local_c0 = this;
  if (this->positionals_at_end_ != true) goto LAB_001250b6;
  pbVar2 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  sVar8 = _count_remaining_positionals(this,true);
  if (sVar8 < (ulong)((long)pbVar1 - (long)pbVar2 >> 5)) {
LAB_001250a9:
    cVar10 = '\0';
  }
  else {
    puVar12 = (this->options_).
              super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    puVar3 = (this->options_).
             super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (puVar12 != puVar3) {
      do {
        pOVar4 = (puVar12->_M_t).
                 super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
                 super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                 super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
        cVar10 = '\0';
        if ((((pOVar4->pname_)._M_string_length != 0) &&
            ((pOVar4->super_OptionBase<CLI::Option>).required_ == true)) &&
           ((int)((ulong)((long)*(pointer *)
                                 ((long)&(pOVar4->results_).
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 + 8) -
                         *(long *)&(pOVar4->results_).
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl) >> 5) < pOVar4->expected_min_ * pOVar4->type_size_min_)
           ) {
          if (local_c0->validate_positionals_ == true) {
            local_e0._0_8_ = local_e0 + 0x10;
            pcVar5 = pbVar1[-1]._M_dataplus._M_p;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)local_e0,pcVar5,pcVar5 + pbVar1[-1]._M_string_length);
            Option::_validate((string *)&local_88,
                              (puVar12->_M_t).
                              super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>.
                              _M_t.
                              super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>
                              .super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl,
                              (string *)local_e0,0);
            ::std::__cxx11::string::operator=((string *)local_e0,(string *)local_88._M_local_buf);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_88._M_allocated_capacity != &local_78) {
              operator_delete((void *)local_88._M_allocated_capacity,
                              local_78._M_allocated_capacity + 1);
            }
            uVar7 = local_e0._8_8_;
            bVar13 = local_e0._8_8_ != 0;
            if ((Option *)local_e0._0_8_ != (Option *)(local_e0 + 0x10)) {
              operator_delete((void *)local_e0._0_8_,local_e0._16_8_ + 1);
            }
            if (uVar7 != 0) {
              cVar10 = bVar13 * '\x03';
              goto LAB_00125084;
            }
          }
          pOVar4 = (puVar12->_M_t).
                   super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
                   super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                   super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
          pcVar5 = pbVar1[-1]._M_dataplus._M_p;
          local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_a8,pcVar5,pcVar5 + pbVar1[-1]._M_string_length);
          Option::_add_result(pOVar4,&local_a8,&pOVar4->results_);
          pOVar4->current_option_state_ = parsing;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
            operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
          }
          local_e0._0_8_ =
               (puVar12->_M_t).super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>
               ._M_t.super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
               super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
          ::std::vector<CLI::Option*,std::allocator<CLI::Option*>>::emplace_back<CLI::Option*>
                    ((vector<CLI::Option*,std::allocator<CLI::Option*>> *)&this->parse_order_,
                     (Option **)local_e0);
          pbVar2 = (args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
          (args->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_finish = pbVar2 + -1;
          pcVar5 = pbVar2[-1]._M_dataplus._M_p;
          cVar10 = '\x01';
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)pcVar5 != &pbVar2[-1].field_2) {
            operator_delete(pcVar5,pbVar2[-1].field_2._M_allocated_capacity + 1);
          }
        }
LAB_00125084:
        if ((cVar10 != '\x03') && (cVar10 != '\0')) goto LAB_0012509f;
        puVar12 = puVar12 + 1;
      } while (puVar12 != puVar3);
    }
    cVar10 = '\x02';
LAB_0012509f:
    this = local_c0;
    if (cVar10 == '\x02') goto LAB_001250a9;
  }
  if (cVar10 != '\0') {
    return true;
  }
LAB_001250b6:
  puVar12 = (this->options_).
            super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar3 = (this->options_).
           super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar12 != puVar3) {
    local_b0 = (vector<CLI::Option*,std::allocator<CLI::Option*>> *)&this->parse_order_;
    do {
      pOVar4 = (puVar12->_M_t).super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>
               ._M_t.super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
               super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
      cVar10 = '\0';
      if (((pOVar4->pname_)._M_string_length != 0) &&
         (((int)((ulong)((long)*(pointer *)
                                ((long)&(pOVar4->results_).
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                + 8) -
                        *(long *)&(pOVar4->results_).
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl) >> 5) < pOVar4->expected_min_ * pOVar4->type_size_min_
          || (pOVar4->allow_extra_args_ == true)))) {
        if (this->validate_positionals_ == true) {
          local_e0._0_8_ = local_e0 + 0x10;
          pcVar5 = pbVar1[-1]._M_dataplus._M_p;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)local_e0,pcVar5,pcVar5 + pbVar1[-1]._M_string_length);
          Option::_validate((string *)&local_88,
                            (puVar12->_M_t).
                            super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>.
                            _M_t.
                            super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>
                            .super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl,
                            (string *)local_e0,0);
          ::std::__cxx11::string::operator=((string *)local_e0,(string *)local_88._M_local_buf);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88._M_allocated_capacity != &local_78) {
            operator_delete((void *)local_88._M_allocated_capacity,
                            local_78._M_allocated_capacity + 1);
          }
          uVar7 = local_e0._8_8_;
          bVar13 = local_e0._8_8_ != 0;
          if ((Option *)local_e0._0_8_ != (Option *)(local_e0 + 0x10)) {
            operator_delete((void *)local_e0._0_8_,local_e0._16_8_ + 1);
          }
          this = local_c0;
          if (uVar7 != 0) {
            cVar10 = bVar13 * '\x05';
            goto LAB_00125295;
          }
        }
        pOVar4 = (puVar12->_M_t).
                 super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
                 super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                 super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
        pcVar5 = pbVar1[-1]._M_dataplus._M_p;
        local_68._M_allocated_capacity = (size_type)&local_58;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_68,pcVar5,pcVar5 + pbVar1[-1]._M_string_length);
        Option::_add_result(pOVar4,(string *)&local_68,&pOVar4->results_);
        pOVar4->current_option_state_ = parsing;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._M_allocated_capacity != &local_58) {
          operator_delete((void *)local_68._M_allocated_capacity,local_58._M_allocated_capacity + 1)
          ;
        }
        local_e0._0_8_ =
             (puVar12->_M_t).super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>.
             _M_t.super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
             super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
        ::std::vector<CLI::Option*,std::allocator<CLI::Option*>>::emplace_back<CLI::Option*>
                  (local_b0,(Option **)local_e0);
        pbVar2 = (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
        (args->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish = pbVar2 + -1;
        pcVar5 = pbVar2[-1]._M_dataplus._M_p;
        cVar10 = '\x01';
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar5 != &pbVar2[-1].field_2) {
          operator_delete(pcVar5,pbVar2[-1].field_2._M_allocated_capacity + 1);
        }
      }
LAB_00125295:
      if ((cVar10 != '\x05') && (cVar10 != '\0')) {
        return true;
      }
      puVar12 = puVar12 + 1;
    } while (puVar12 != puVar3);
  }
  psVar6 = (this->subcommands_).
           super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (psVar11 = (this->subcommands_).
                 super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; psVar11 != psVar6; psVar11 = psVar11 + 1
      ) {
    pAVar9 = (psVar11->super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    if ((((pAVar9->name_)._M_string_length == 0) && (pAVar9->disabled_ == false)) &&
       (bVar13 = _parse_positional(pAVar9,args,false), bVar13)) {
      pAVar9 = (psVar11->super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      if (pAVar9->pre_parse_called_ == false) {
        _trigger_pre_parse(pAVar9,(long)(args->
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        )._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(args->
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        )._M_impl.super__Vector_impl_data._M_start >> 5);
        return true;
      }
      return true;
    }
  }
  if ((this->parent_ != (App *)0x0) && (this->fallthrough_ == true)) {
    pAVar9 = _get_fallthrough_parent(this);
    bVar13 = _parse_positional(pAVar9,args,
                               (this->parse_complete_callback_).super__Function_base._M_manager !=
                               (_Manager_type)0x0);
    return bVar13;
  }
  pAVar9 = _find_subcommand(this,(args->
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_finish + -1,true,false);
  if ((pAVar9 == (App *)0x0) ||
     ((this->require_subcommand_max_ != 0 &&
      (this->require_subcommand_max_ <=
       (ulong)((long)(this->parsed_subcommands_).
                     super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(this->parsed_subcommands_).
                     super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
                     super__Vector_impl_data._M_start >> 3))))) {
    pAVar9 = this;
    if (this->parent_ != (App *)0x0) {
      pAVar9 = _get_fallthrough_parent(this);
    }
    pAVar9 = _find_subcommand(pAVar9,(args->
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     )._M_impl.super__Vector_impl_data._M_finish + -1,true,false);
    if (pAVar9 != (App *)0x0) {
      pAVar9 = pAVar9->parent_;
      if (pAVar9->require_subcommand_max_ == 0) {
        return false;
      }
      if ((ulong)((long)(pAVar9->parsed_subcommands_).
                        super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)(pAVar9->parsed_subcommands_).
                        super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
                        super__Vector_impl_data._M_start >> 3) < pAVar9->require_subcommand_max_) {
        return false;
      }
    }
    if (this->positionals_at_end_ == true) {
      this_00 = (ExtrasError *)__cxa_allocate_exception(0x38);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_48,args);
      ExtrasError::ExtrasError(this_00,&local_c0->name_,&local_48);
      __cxa_throw(this_00,&ExtrasError::typeinfo,Error::~Error);
    }
    if ((this->parent_ == (App *)0x0) || ((this->name_)._M_string_length != 0)) {
      _move_to_missing(this,NONE,pbVar1 + -1);
      pbVar1 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      (args->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish = pbVar1 + -1;
      pcVar5 = pbVar1[-1]._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar5 != &pbVar1[-1].field_2) {
        operator_delete(pcVar5,pbVar1[-1].field_2._M_allocated_capacity + 1);
      }
      if (this->prefix_command_ == true) {
        while (pbVar1 = (args->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish,
              (args->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start != pbVar1) {
          _move_to_missing(this,NONE,pbVar1 + -1);
          pbVar1 = (args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
          (args->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_finish = pbVar1 + -1;
          pcVar5 = pbVar1[-1]._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)pcVar5 != &pbVar1[-1].field_2) {
            operator_delete(pcVar5,pbVar1[-1].field_2._M_allocated_capacity + 1);
          }
        }
        return true;
      }
      return true;
    }
  }
  else if ((char)local_b4 == '\0') {
    pbVar1 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    (args->
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    )._M_impl.super__Vector_impl_data._M_finish = pbVar1 + -1;
    pcVar5 = pbVar1[-1]._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar5 != &pbVar1[-1].field_2) {
      operator_delete(pcVar5,pbVar1[-1].field_2._M_allocated_capacity + 1);
    }
    _parse(pAVar9,args);
    return true;
  }
  return false;
}

Assistant:

bool _parse_positional(std::vector<std::string> &args, bool haltOnSubcommand) {

        const std::string &positional = args.back();

        if(positionals_at_end_) {
            // deal with the case of required arguments at the end which should take precedence over other arguments
            auto arg_rem = args.size();
            auto remreq = _count_remaining_positionals(true);
            if(arg_rem <= remreq) {
                for(const Option_p &opt : options_) {
                    if(opt->get_positional() && opt->required_) {
                        if(static_cast<int>(opt->count()) < opt->get_items_expected_min()) {
                            if(validate_positionals_) {
                                std::string pos = positional;
                                pos = opt->_validate(pos, 0);
                                if(!pos.empty()) {
                                    continue;
                                }
                            }
                            opt->add_result(positional);
                            parse_order_.push_back(opt.get());
                            args.pop_back();
                            return true;
                        }
                    }
                }
            }
        }
        for(const Option_p &opt : options_) {
            // Eat options, one by one, until done
            if(opt->get_positional() &&
               (static_cast<int>(opt->count()) < opt->get_items_expected_min() || opt->get_allow_extra_args())) {
                if(validate_positionals_) {
                    std::string pos = positional;
                    pos = opt->_validate(pos, 0);
                    if(!pos.empty()) {
                        continue;
                    }
                }
                opt->add_result(positional);
                parse_order_.push_back(opt.get());
                args.pop_back();
                return true;
            }
        }

        for(auto &subc : subcommands_) {
            if((subc->name_.empty()) && (!subc->disabled_)) {
                if(subc->_parse_positional(args, false)) {
                    if(!subc->pre_parse_called_) {
                        subc->_trigger_pre_parse(args.size());
                    }
                    return true;
                }
            }
        }
        // let the parent deal with it if possible
        if(parent_ != nullptr && fallthrough_)
            return _get_fallthrough_parent()->_parse_positional(args, static_cast<bool>(parse_complete_callback_));

        /// Try to find a local subcommand that is repeated
        auto com = _find_subcommand(args.back(), true, false);
        if(com != nullptr && (require_subcommand_max_ == 0 || require_subcommand_max_ > parsed_subcommands_.size())) {
            if(haltOnSubcommand) {
                return false;
            }
            args.pop_back();
            com->_parse(args);
            return true;
        }
        /// now try one last gasp at subcommands that have been executed before, go to root app and try to find a
        /// subcommand in a broader way, if one exists let the parent deal with it
        auto parent_app = (parent_ != nullptr) ? _get_fallthrough_parent() : this;
        com = parent_app->_find_subcommand(args.back(), true, false);
        if(com != nullptr && (com->parent_->require_subcommand_max_ == 0 ||
                              com->parent_->require_subcommand_max_ > com->parent_->parsed_subcommands_.size())) {
            return false;
        }

        if(positionals_at_end_) {
            throw CLI::ExtrasError(name_, args);
        }
        /// If this is an option group don't deal with it
        if(parent_ != nullptr && name_.empty()) {
            return false;
        }
        /// We are out of other options this goes to missing
        _move_to_missing(detail::Classifier::NONE, positional);
        args.pop_back();
        if(prefix_command_) {
            while(!args.empty()) {
                _move_to_missing(detail::Classifier::NONE, args.back());
                args.pop_back();
            }
        }

        return true;
    }